

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pem_pk8.cc
# Opt level: O0

EVP_PKEY * d2i_PKCS8PrivateKey_fp(FILE *fp,EVP_PKEY **x,undefined1 *cb,void *u)

{
  BIO *bp_00;
  EVP_PKEY *ret;
  BIO *bp;
  void *u_local;
  pem_password_cb *cb_local;
  EVP_PKEY **x_local;
  FILE *fp_local;
  
  bp_00 = BIO_new_fp(fp,0);
  if (bp_00 == (BIO *)0x0) {
    ERR_put_error(9,0,7,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pem/pem_pk8.cc"
                  ,0xc3);
    fp_local = (FILE *)0x0;
  }
  else {
    fp_local = (FILE *)d2i_PKCS8PrivateKey_bio(bp_00,x,cb,u);
    BIO_free(bp_00);
  }
  return (EVP_PKEY *)fp_local;
}

Assistant:

EVP_PKEY *d2i_PKCS8PrivateKey_fp(FILE *fp, EVP_PKEY **x, pem_password_cb *cb,
                                 void *u) {
  BIO *bp;
  EVP_PKEY *ret;
  if (!(bp = BIO_new_fp(fp, BIO_NOCLOSE))) {
    OPENSSL_PUT_ERROR(PEM, ERR_R_BUF_LIB);
    return NULL;
  }
  ret = d2i_PKCS8PrivateKey_bio(bp, x, cb, u);
  BIO_free(bp);
  return ret;
}